

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxx_eventlistener.hpp
# Opt level: O1

void __thiscall
mxx_gtest::MpiTestEventListener::OnTestEnd(MpiTestEventListener *this,TestInfo *test_info)

{
  TestResult *this_00;
  bool bVar1;
  char cVar2;
  int iVar3;
  TestPartResult *pTVar4;
  istream *piVar5;
  ostream *poVar6;
  char *pcVar7;
  int i;
  int len;
  int line_1;
  int p;
  int line;
  string message;
  string linestr;
  MPI_Status stat;
  int end;
  string msg;
  undefined4 local_400;
  int local_3fc;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f8;
  int local_3ec;
  char *local_3e8;
  undefined8 local_3e0;
  char local_3d8 [16];
  undefined1 *local_3c8;
  undefined8 local_3c0;
  undefined1 local_3b8 [16];
  char *local_3a8;
  long local_3a0;
  char local_398 [16];
  TestInfo *local_388;
  MpiTestEventListener *local_380;
  AssertHelper local_378;
  char *local_370;
  long local_368;
  char local_360 [16];
  undefined1 local_350 [24];
  undefined4 local_338;
  undefined4 uStack_334;
  undefined4 local_330;
  ostream local_328 [112];
  ios_base local_2b8 [264];
  undefined1 *local_1b0;
  undefined4 local_1a8;
  undefined1 local_1a0 [104];
  ios_base local_138 [264];
  
  local_388 = test_info;
  local_380 = this;
  if (this->rank == 0) {
    MPI_Comm_size(&ompi_mpi_comm_world,&local_3ec);
    if (1 < local_3ec) {
      iVar3 = 1;
      do {
        local_3e8 = local_3d8;
        local_3e0 = 0;
        local_3d8[0] = '\0';
        local_3c8 = local_3b8;
        local_3c0 = 0;
        local_3b8[0] = 0;
        MPI_Recv(&local_3fc,1,&ompi_mpi_int,iVar3,0,&ompi_mpi_comm_world,0);
        while (local_3fc != -0xd) {
          MPI_Probe(iVar3,0,&ompi_mpi_comm_world,local_350);
          MPI_Get_count(local_350,&ompi_mpi_char,&local_400);
          std::__cxx11::string::resize((ulong)&local_3e8,(char)local_400);
          MPI_Recv(local_3e8,local_400,&ompi_mpi_char,iVar3,0,&ompi_mpi_comm_world,0);
          MPI_Probe(iVar3,0,&ompi_mpi_comm_world,local_350);
          MPI_Get_count(local_350,&ompi_mpi_char,&local_400);
          std::__cxx11::string::resize((ulong)&local_3c8,(char)local_400);
          MPI_Recv(local_3c8,local_400,&ompi_mpi_char,iVar3,0,&ompi_mpi_comm_world,0);
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)&local_1b0,(string *)&local_3c8,_S_in);
          std::__cxx11::stringstream::stringstream((stringstream *)&local_338);
          local_3a8 = local_398;
          local_3a0 = 0;
          local_398[0] = '\0';
          while( true ) {
            cVar2 = std::ios::widen((char)*(undefined8 *)(local_1b0 + -0x18) +
                                    (char)(istringstream *)&local_1b0);
            piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                               ((istream *)&local_1b0,(string *)&local_3a8,cVar2);
            if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
            std::__ostream_insert<char,std::char_traits<char>>(local_328,"[Rank ",6);
            poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_328,iVar3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] ",2);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_3a8,local_3a0);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
            std::ostream::put((char)poVar6);
            std::ostream::flush();
          }
          testing::Message::Message((Message *)&local_3f8);
          std::__cxx11::stringbuf::str();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_3f8.ptr_ + 0x10),local_370,local_368);
          testing::internal::AssertHelper::AssertHelper
                    (&local_378,kNonFatalFailure,local_3e8,local_3fc,"Failed");
          testing::internal::AssertHelper::operator=(&local_378,(Message *)&local_3f8);
          testing::internal::AssertHelper::~AssertHelper(&local_378);
          if (local_370 != local_360) {
            operator_delete(local_370);
          }
          if (local_3f8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               (local_3f8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_3f8.ptr_ + 8))();
            }
            local_3f8.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
          MPI_Recv(&local_3fc,1,&ompi_mpi_int,iVar3,0,&ompi_mpi_comm_world,0);
          if (local_3a8 != local_398) {
            operator_delete(local_3a8);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)&local_338);
          std::ios_base::~ios_base(local_2b8);
          std::__cxx11::istringstream::~istringstream((istringstream *)&local_1b0);
          std::ios_base::~ios_base(local_138);
        }
        if (local_3c8 != local_3b8) {
          operator_delete(local_3c8);
        }
        if (local_3e8 != local_3d8) {
          operator_delete(local_3e8);
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 < local_3ec);
    }
  }
  else {
    this_00 = &test_info->result_;
    bVar1 = testing::TestResult::Failed(this_00);
    if (bVar1) {
      iVar3 = testing::TestResult::total_part_count(this_00);
      if (0 < iVar3) {
        i = 0;
        do {
          pTVar4 = testing::TestResult::GetTestPartResult(this_00,i);
          if (pTVar4->type_ != kSuccess) {
            pTVar4 = testing::TestResult::GetTestPartResult(this_00,i);
            local_3e8 = (char *)CONCAT44(local_3e8._4_4_,pTVar4->line_number_);
            pTVar4 = testing::TestResult::GetTestPartResult(this_00,i);
            pcVar7 = (char *)(pTVar4->file_name_)._M_string_length;
            if (pcVar7 != (char *)0x0) {
              pcVar7 = (pTVar4->file_name_)._M_dataplus._M_p;
            }
            std::__cxx11::string::string((string *)&local_338,pcVar7,(allocator *)&local_1b0);
            pTVar4 = testing::TestResult::GetTestPartResult(this_00,i);
            std::__cxx11::string::string
                      ((string *)&local_1b0,(pTVar4->message_)._M_dataplus._M_p,
                       (allocator *)&local_3c8);
            MPI_Send(&local_3e8,1,&ompi_mpi_int,0,0,&ompi_mpi_comm_world);
            MPI_Send(CONCAT44(uStack_334,local_338),local_330,&ompi_mpi_char,0,0,
                     &ompi_mpi_comm_world);
            MPI_Send(local_1b0,local_1a8,&ompi_mpi_char,0,0,&ompi_mpi_comm_world);
            if (local_1b0 != local_1a0) {
              operator_delete(local_1b0);
            }
            if ((ostream *)CONCAT44(uStack_334,local_338) != local_328) {
              operator_delete((ostream *)CONCAT44(uStack_334,local_338));
            }
          }
          i = i + 1;
        } while (iVar3 != i);
      }
    }
    local_338 = 0xfffffff3;
    MPI_Send(&local_338,1,&ompi_mpi_int,0,0,&ompi_mpi_comm_world);
  }
  if (local_380->rank == 0) {
    (*local_380->other->_vptr_TestEventListener[9])(local_380->other,local_388);
  }
  return;
}

Assistant:

virtual void OnTestEnd(const TestInfo& test_info)
    {
        // serialze all failed TestPartResults and send to rank 0
        // there, receive and ADD_FAILURE_AT() for the remote error

        // first send lineno, since -1 is used by google for unknown line numbers
        // we use -13 for "no more fails"
        if (rank != 0) {
            if (!test_info.result()->Passed()) {
                int count = test_info.result()->total_part_count();
                for (int i = 0; i < count; ++i) {
                    if (!test_info.result()->GetTestPartResult(i).passed()) {
                        // get result information for failed tests
                        int line = test_info.result()->GetTestPartResult(i).line_number();
                        std::string filename(test_info.result()->GetTestPartResult(i).file_name());
                        std::string msg(test_info.result()->GetTestPartResult(i).message());
                        // send info to rank 0
                        // TODO: replace with mxx calls?
                        // TODO: custom communicator?
                        // TODO: use custom `tag`? currently all are tag `0`
                        MPI_Send(&line, 1, MPI_INT, 0, 0, MPI_COMM_WORLD);
                        MPI_Send(&filename[0], filename.size(), MPI_CHAR, 0, 0, MPI_COMM_WORLD);
                        MPI_Send(&msg[0], msg.size(), MPI_CHAR, 0, 0, MPI_COMM_WORLD);
                    }
                }
            }
            // send the END message (line = -13)
            int end = -13;
            MPI_Send(&end, 1, MPI_INT, 0, 0, MPI_COMM_WORLD);
        } else {
            // rank 0: in a for loop over all ranks, receive the failing messages
            int p;
            MPI_Comm_size(MPI_COMM_WORLD, &p);
            for (int i = 1; i < p; ++i)
            {
                int line;
                std::string filename;
                std::string message;
                MPI_Recv(&line, 1, MPI_INT, i, 0, MPI_COMM_WORLD, MPI_STATUS_IGNORE);
                while (line != -13) {
                    // receive filename and message
                    // TODO: use mxx std::string overloads for recv
                    MPI_Status stat;
                    int len;
                    // filename
                    MPI_Probe(i, 0, MPI_COMM_WORLD, &stat);
                    MPI_Get_count(&stat, MPI_CHAR, &len);
                    filename.resize(len);
                    MPI_Recv(&filename[0], len, MPI_CHAR, i, 0, MPI_COMM_WORLD, MPI_STATUS_IGNORE);
                    // message
                    MPI_Probe(i, 0, MPI_COMM_WORLD, &stat);
                    MPI_Get_count(&stat, MPI_CHAR, &len);
                    message.resize(len);
                    MPI_Recv(&message[0], len, MPI_CHAR, i, 0, MPI_COMM_WORLD, MPI_STATUS_IGNORE);

                    // modify message, add `[Rank x]` in front of each line
                    std::istringstream iss(message);
                    std::stringstream ss;
                    std::string linestr;
                    while (std::getline(iss, linestr)) {
                        ss << "[Rank " << i << "] " << linestr << std::endl;
                    }
                    ADD_FAILURE_AT(filename.c_str(), line) << ss.str();

                    // receive next line or end message
                    MPI_Recv(&line, 1, MPI_INT, i, 0, MPI_COMM_WORLD, MPI_STATUS_IGNORE);
                }
            }
        }
        if (rank == 0)
          other->OnTestEnd(test_info);
    }